

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

pair<QTableWidgetItem_*,_int> * __thiscall
QtPrivate::QPodArrayOps<std::pair<QTableWidgetItem_*,_int>_>::createHole
          (QPodArrayOps<std::pair<QTableWidgetItem_*,_int>_> *this,GrowthPosition pos,
          qsizetype where,qsizetype n)

{
  qsizetype *pqVar1;
  pair<QTableWidgetItem_*,_int> *ppVar2;
  long lVar3;
  long lVar4;
  pair<QTableWidgetItem_*,_int> *__src;
  
  ppVar2 = (this->super_QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>).ptr;
  __src = ppVar2 + where;
  if (pos == GrowsAtEnd) {
    lVar3 = (this->super_QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>).size;
    lVar4 = lVar3 - where;
    if (lVar4 != 0 && where <= lVar3) {
      memmove(__src + n,__src,lVar4 * 0x10);
    }
  }
  else {
    (this->super_QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>).ptr = ppVar2 + -n;
    __src = __src + -n;
  }
  pqVar1 = &(this->super_QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>).size;
  *pqVar1 = *pqVar1 + n;
  return __src;
}

Assistant:

T *createHole(QArrayData::GrowthPosition pos, qsizetype where, qsizetype n)
    {
        Q_ASSERT((pos == QArrayData::GrowsAtBeginning && n <= this->freeSpaceAtBegin()) ||
                 (pos == QArrayData::GrowsAtEnd && n <= this->freeSpaceAtEnd()));

        T *insertionPoint = this->ptr + where;
        if (pos == QArrayData::GrowsAtEnd) {
            if (where < this->size)
                ::memmove(static_cast<void *>(insertionPoint + n), static_cast<void *>(insertionPoint), (this->size - where) * sizeof(T));
        } else {
            Q_ASSERT(where == 0);
            this->ptr -= n;
            insertionPoint -= n;
        }
        this->size += n;
        return insertionPoint;
    }